

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_4ae09b::TestPresetExecutionShowOnlyHelper(ShowOnlyEnum *out,Value *value)

{
  bool bVar1;
  String local_60;
  String local_40;
  Value *local_20;
  Value *value_local;
  ShowOnlyEnum *out_local;
  
  if ((value == (Value *)0x0) ||
     (local_20 = value, value_local = (Value *)out, bVar1 = Json::Value::isString(value), !bVar1)) {
    return INVALID_PRESET;
  }
  Json::Value::asString_abi_cxx11_(&local_40,local_20);
  bVar1 = std::operator==(&local_40,"human");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    *(undefined4 *)&value_local->value_ = 0;
    return READ_OK;
  }
  Json::Value::asString_abi_cxx11_(&local_60,local_20);
  bVar1 = std::operator==(&local_60,"json-v1");
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    return INVALID_PRESET;
  }
  *(undefined4 *)&value_local->value_ = 1;
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value)
{
  if (!value || !value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}